

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dropt.c
# Opt level: O1

dropt_error get_and_print_dropt_error(dropt_context *context)

{
  dropt_error dVar1;
  
  dVar1 = dropt_get_error();
  if (dVar1 != 0) {
    get_and_print_dropt_error_cold_1();
  }
  return dVar1;
}

Assistant:

static dropt_error
get_and_print_dropt_error(dropt_context* context)
{
    dropt_error error = dropt_get_error(context);
    if (error != dropt_error_none)
    {
        ftprintf(stderr, T("[%d] %s\n"),
                 error, dropt_get_error_message(context));
        dropt_clear_error(context);
    }
    return error;
}